

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  u8 uVar2;
  int in2;
  int iVar3;
  Select *pSVar4;
  uint uVar5;
  Expr *pEVar6;
  uint p3;
  bool bVar7;
  int regFree1;
  int regFree2;
  
  p = pParse->pVdbe;
  _regFree1 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  bVar1 = pExpr->op;
  uVar5 = (uint)bVar1;
  if (0x9f < bVar1) {
    if (bVar1 != 0xa0) {
      if (uVar5 == 0xa7) {
        bVar7 = pExpr->op2 == 0xa0;
        pEVar6 = pExpr->pLeft;
        jumpIfNull = (uint)!bVar7 << 4;
        if (((pExpr->pRight->u).zToken[4] != '\0') != bVar7) goto LAB_0016cf4c;
        goto LAB_0016d040;
      }
      goto switchD_0016ce46_caseD_2e;
    }
switchD_0016ce46_caseD_2d:
    uVar5 = bVar1 == 0x2d ^ 0x35;
    jumpIfNull = 0x80;
switchD_0016ce46_caseD_34:
    pEVar6 = pExpr->pLeft;
    uVar2 = pEVar6->op;
    if (uVar2 == 0xa8) {
      uVar2 = pEVar6->op2;
    }
    if (uVar2 == 0x83) {
      pSVar4 = (pEVar6->x).pSelect;
LAB_0016ceea:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->nExpr)
      goto switchD_0016ce46_caseD_2e;
    }
    else if (uVar2 == 0xa9) {
      pSVar4 = (Select *)&pEVar6->x;
      goto LAB_0016ceea;
    }
    iVar3 = sqlite3ExprCodeTemp(pParse,pEVar6,&regFree1);
    in2 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pExpr->pLeft,pExpr->pRight,uVar5,iVar3,in2,dest,jumpIfNull);
    goto LAB_0016d069;
  }
  if (bVar1 - 0x2b < 0xf) {
    uVar5 = uVar5 ^ 1;
    switch((uint)bVar1) {
    case 0x2b:
      iVar3 = pParse->nLabel + -1;
      pParse->nLabel = iVar3;
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,iVar3,jumpIfNull ^ 0x10);
      sqlite3ExprIfFalse(pParse,pExpr->pRight,dest,jumpIfNull);
      break;
    case 0x2c:
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      pEVar6 = pExpr->pRight;
LAB_0016d040:
      sqlite3ExprIfFalse(pParse,pEVar6,dest,jumpIfNull);
      goto LAB_0016d069;
    case 0x2d:
      goto switchD_0016ce46_caseD_2d;
    case 0x2e:
    case 0x2f:
      goto switchD_0016ce46_caseD_2e;
    case 0x30:
      exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfFalse,jumpIfNull);
      goto LAB_0016d069;
    case 0x31:
      if (jumpIfNull != 0) {
        sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
        goto LAB_0016d069;
      }
      iVar3 = pParse->nLabel + -1;
      pParse->nLabel = iVar3;
      sqlite3ExprCodeIN(pParse,pExpr,dest,iVar3);
      break;
    case 0x32:
    case 0x33:
      iVar3 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      goto LAB_0016cf6c;
    default:
      goto switchD_0016ce46_caseD_34;
    }
    sqlite3VdbeResolveLabel(p,iVar3);
  }
  else {
    if (uVar5 == 0x13) {
      pEVar6 = pExpr->pLeft;
LAB_0016cf4c:
      sqlite3ExprIfTrue(pParse,pEVar6,dest,jumpIfNull);
      goto LAB_0016d069;
    }
switchD_0016ce46_caseD_2e:
    iVar3 = exprAlwaysFalse(pExpr);
    if (iVar3 == 0) {
      iVar3 = exprAlwaysTrue(pExpr);
      if (iVar3 != 0) goto LAB_0016d069;
      iVar3 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
      p3 = (uint)(jumpIfNull != 0);
      uVar5 = 0x14;
    }
    else {
      uVar5 = 0xb;
      iVar3 = 0;
LAB_0016cf6c:
      p3 = 0;
    }
    sqlite3VdbeAddOp3(p,uVar5,iVar3,dest,p3);
  }
LAB_0016d069:
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      break;
    }
    case TK_OR: {
      int d2 = sqlite3VdbeMakeLabel(pParse);
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2, jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;   /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;  /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        /* IS TRUE and IS NOT FALSE */
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? 0 : SQLITE_JUMPIFNULL);

      }else{
        /* IS FALSE and IS NOT TRUE */
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? 0 : SQLITE_JUMPIFNULL);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( op==TK_ISNULL );   VdbeCoverageIf(v, op==TK_ISNULL);
      testcase( op==TK_NOTNULL );  VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfFalse, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(pParse);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
    default_expr: 
      if( exprAlwaysFalse(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( exprAlwaysTrue(pExpr) ){
        /* no-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}